

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacCom.c
# Opt level: O0

int Bac_CommandPs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Bac_Man_t *p_00;
  char *pcVar2;
  uint local_3c;
  uint local_38;
  int fVerbose;
  int nModules;
  int c;
  Bac_Man_t *p;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  p_00 = Bac_AbcGetMan(pAbc);
  local_38 = 0;
  local_3c = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"Mvh");
      if (iVar1 == -1) {
        if (p_00 == (Bac_Man_t *)0x0) {
          Abc_Print(1,"Bac_CommandPs(): There is no current design.\n");
          return 0;
        }
        Bac_ManPrintStats(p_00,local_38,local_3c);
        return 0;
      }
      if (iVar1 == 0x4d) break;
      if ((iVar1 == 0x68) || (iVar1 != 0x76)) goto LAB_00458109;
      local_3c = local_3c ^ 1;
    }
    if (argc <= globalUtilOptind) break;
    local_38 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)local_38 < 0) {
LAB_00458109:
      Abc_Print(-2,"usage: @_ps [-M num] [-vh]\n");
      Abc_Print(-2,"\t         prints statistics\n");
      Abc_Print(-2,"\t-M num : the number of first modules to report [default = %d]\n",
                (ulong)local_38);
      pcVar2 = "no";
      if (local_3c != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-M\" should be followed by an integer.\n");
  goto LAB_00458109;
}

Assistant:

int Bac_CommandPs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Bac_Man_t * p = Bac_AbcGetMan(pAbc);
    int c, nModules = 0, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Mvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            nModules = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nModules < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( p == NULL )
    {
        Abc_Print( 1, "Bac_CommandPs(): There is no current design.\n" );
        return 0;
    }
    Bac_ManPrintStats( p, nModules, fVerbose );
    return 0;
usage:
    Abc_Print( -2, "usage: @_ps [-M num] [-vh]\n" );
    Abc_Print( -2, "\t         prints statistics\n" );
    Abc_Print( -2, "\t-M num : the number of first modules to report [default = %d]\n", nModules );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}